

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O2

void QPDF::registerStreamFilter
               (string *filter_name,function<std::shared_ptr<QPDFStreamFilter>_()> *factory)

{
  function<std::shared_ptr<QPDFStreamFilter>_()> local_30;
  
  std::function<std::shared_ptr<QPDFStreamFilter>_()>::function(&local_30,factory);
  ::qpdf::Stream::registerStreamFilter(filter_name,&local_30);
  std::_Function_base::~_Function_base(&local_30.super__Function_base);
  return;
}

Assistant:

void
QPDF::registerStreamFilter(
    std::string const& filter_name, std::function<std::shared_ptr<QPDFStreamFilter>()> factory)
{
    qpdf::Stream::registerStreamFilter(filter_name, factory);
}